

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O0

void __thiscall
re2::NFA::AddToThreadq(NFA *this,Threadq *q,int id0,int c,StringPiece *context,char *p,Thread *t0)

{
  bool bVar1;
  InstOp IVar2;
  int iVar3;
  EmptyOp EVar4;
  EmptyOp EVar5;
  ostream *poVar6;
  int in_EDX;
  NFA *in_RDI;
  char *in_R9;
  Thread *in_stack_00000008;
  Inst *ip;
  Thread *t;
  int j;
  Thread **tp;
  int id;
  AddState a;
  int nstk;
  AddState *stk;
  int in_stack_fffffffffffffd0c;
  Prog *in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  InstOp in_stack_fffffffffffffd1c;
  LogMessage *in_stack_fffffffffffffd20;
  LogMessage *in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  LogMessage *in_stack_fffffffffffffd50;
  undefined4 uStack_2a4;
  int in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  StringPiece *in_stack_fffffffffffffd70;
  undefined4 uStack_284;
  undefined4 uStack_274;
  uint uStack_264;
  undefined4 uStack_254;
  undefined4 uStack_244;
  undefined4 uStack_234;
  undefined4 uStack_224;
  LogMessage local_208;
  Inst *local_88;
  Thread *local_80;
  int local_74;
  Thread **local_70;
  undefined8 local_68;
  int local_5c;
  undefined8 local_58;
  Thread *local_50;
  int local_48;
  undefined4 uStack_44;
  undefined8 local_40;
  int local_34;
  AddState *local_30;
  char *local_28;
  int local_14;
  
  if (in_EDX != 0) {
    local_28 = in_R9;
    local_14 = in_EDX;
    local_30 = PODArray<re2::NFA::AddState>::data((PODArray<re2::NFA::AddState> *)0x231587);
    local_48 = local_14;
    local_40 = 0;
    local_34 = 1;
    *(ulong *)local_30 = CONCAT44(uStack_44,local_14);
    local_30->t = (Thread *)0x0;
LAB_002315f0:
    if (0 < local_34) {
      local_34 = local_34 + -1;
      local_58 = *(undefined8 *)(local_30 + local_34);
      local_50 = local_30[local_34].t;
LAB_00231638:
      if (local_50 != (Thread *)0x0) {
        Decref(in_RDI,in_stack_00000008);
        in_stack_00000008 = local_50;
      }
      local_5c = (int)local_58;
      if (((int)local_58 == 0) ||
         (bVar1 = SparseArray<re2::NFA::Thread_*>::has_index
                            ((SparseArray<re2::NFA::Thread_*> *)in_stack_fffffffffffffd28,
                             (int)((ulong)in_stack_fffffffffffffd20 >> 0x20)), bVar1))
      goto LAB_002315f0;
      local_68 = 0;
      SparseArray<re2::NFA::Thread_*>::set_new
                ((SparseArray<re2::NFA::Thread_*> *)in_stack_fffffffffffffd10,
                 in_stack_fffffffffffffd0c,(Thread **)0x2316c9);
      local_70 = SparseArray<re2::NFA::Thread_*>::get_existing
                           ((SparseArray<re2::NFA::Thread_*> *)in_stack_fffffffffffffd10,
                            in_stack_fffffffffffffd0c);
      local_88 = Prog::inst(in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c);
      IVar2 = Prog::Inst::opcode(local_88);
      switch(IVar2) {
      case kInstAltMatch:
        local_80 = Incref(in_RDI,in_stack_00000008);
        *local_70 = local_80;
        local_58 = CONCAT44(uStack_224,local_5c + 1);
        local_50 = (Thread *)0x0;
        goto LAB_00231638;
      case kInstByteRange:
        bVar1 = Prog::Inst::Matches((Inst *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
        if (bVar1) {
          local_80 = Incref(in_RDI,in_stack_00000008);
          *local_70 = local_80;
          iVar3 = Prog::Inst::hint(local_88);
          if (iVar3 == 0) goto LAB_002315f0;
          in_stack_fffffffffffffd0c = local_5c;
          iVar3 = Prog::Inst::hint(local_88);
          local_58 = CONCAT44(uStack_284,in_stack_fffffffffffffd0c + iVar3);
          local_50 = (Thread *)0x0;
          goto LAB_00231638;
        }
        break;
      case kInstCapture:
        iVar3 = Prog::Inst::last(local_88);
        if (iVar3 == 0) {
          *(ulong *)(local_30 + local_34) = CONCAT44(uStack_254,local_5c + 1);
          local_30[local_34].t = (Thread *)0x0;
          local_34 = local_34 + 1;
        }
        local_74 = Prog::Inst::cap(local_88);
        if (local_74 < in_RDI->ncapture_) {
          *(ulong *)(local_30 + local_34) = (ulong)uStack_264 << 0x20;
          local_30[local_34].t = in_stack_00000008;
          local_34 = local_34 + 1;
          local_80 = AllocThread((NFA *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18
                                                ));
          CopyCapture(in_RDI,local_80->capture,in_stack_00000008->capture);
          local_80->capture[local_74] = local_28;
          in_stack_00000008 = local_80;
        }
        iVar3 = Prog::Inst::out(local_88);
        local_58 = CONCAT44(uStack_274,iVar3);
        local_50 = (Thread *)0x0;
        goto LAB_00231638;
      case kInstEmptyWidth:
        iVar3 = Prog::Inst::last(local_88);
        if (iVar3 == 0) {
          *(ulong *)(local_30 + local_34) = CONCAT44(uStack_2a4,local_5c + 1);
          local_30[local_34].t = (Thread *)0x0;
          local_34 = local_34 + 1;
        }
        EVar4 = Prog::Inst::empty(local_88);
        EVar5 = Prog::EmptyFlags(in_stack_fffffffffffffd70,
                                 (char *)CONCAT44(in_stack_fffffffffffffd6c,
                                                  in_stack_fffffffffffffd68));
        if ((EVar4 & (EVar5 ^ 0xffffffff)) != 0) goto LAB_002315f0;
        in_stack_fffffffffffffd48 = Prog::Inst::out(local_88);
        in_stack_fffffffffffffd50 = (LogMessage *)0x0;
        local_58 = CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48);
        local_50 = (Thread *)0x0;
        goto LAB_00231638;
      case kInstMatch:
        local_80 = Incref(in_RDI,in_stack_00000008);
        *local_70 = local_80;
        break;
      case kInstNop:
        goto switchD_00231732_caseD_6;
      case kInstFail:
        goto LAB_002315f0;
      default:
        in_stack_fffffffffffffd28 = &local_208;
        LogMessage::LogMessage
                  (in_stack_fffffffffffffd50,
                   (char *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                   (int)((ulong)in_RDI >> 0x20));
        poVar6 = LogMessage::stream(in_stack_fffffffffffffd28);
        in_stack_fffffffffffffd20 = (LogMessage *)std::operator<<(poVar6,"unhandled ");
        in_stack_fffffffffffffd1c = Prog::Inst::opcode(local_88);
        in_stack_fffffffffffffd10 =
             (Prog *)std::ostream::operator<<(in_stack_fffffffffffffd20,in_stack_fffffffffffffd1c);
        std::operator<<((ostream *)in_stack_fffffffffffffd10," in AddToThreadq");
        LogMessage::~LogMessage(in_stack_fffffffffffffd20);
        goto LAB_002315f0;
      }
      iVar3 = Prog::Inst::last(local_88);
      if (iVar3 != 0) goto LAB_002315f0;
      in_stack_fffffffffffffd68 = local_5c + 1;
      in_stack_fffffffffffffd70 = (StringPiece *)0x0;
      local_58 = CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68);
      local_50 = (Thread *)0x0;
      goto LAB_00231638;
    }
  }
  return;
switchD_00231732_caseD_6:
  iVar3 = Prog::Inst::last(local_88);
  if (iVar3 == 0) {
    *(ulong *)(local_30 + local_34) = CONCAT44(uStack_234,local_5c + 1);
    local_30[local_34].t = (Thread *)0x0;
    local_34 = local_34 + 1;
  }
  iVar3 = Prog::Inst::out(local_88);
  local_58 = CONCAT44(uStack_244,iVar3);
  local_50 = (Thread *)0x0;
  goto LAB_00231638;
}

Assistant:

void NFA::AddToThreadq(Threadq* q, int id0, int c, const StringPiece& context,
                       const char* p, Thread* t0) {
  if (id0 == 0)
    return;

  // Use stack_ to hold our stack of instructions yet to process.
  // It was preallocated as follows:
  //   two entries per Capture;
  //   one entry per EmptyWidth; and
  //   one entry per Nop.
  // This reflects the maximum number of stack pushes that each can
  // perform. (Each instruction can be processed at most once.)
  AddState* stk = stack_.data();
  int nstk = 0;

  stk[nstk++] = {id0, NULL};
  while (nstk > 0) {
    DCHECK_LE(nstk, stack_.size());
    AddState a = stk[--nstk];

  Loop:
    if (a.t != NULL) {
      // t0 was a thread that we allocated and copied in order to
      // record the capture, so we must now decref it.
      Decref(t0);
      t0 = a.t;
    }

    int id = a.id;
    if (id == 0)
      continue;
    if (q->has_index(id)) {
      if (ExtraDebug)
        fprintf(stderr, "  [%d%s]\n", id, FormatCapture(t0->capture).c_str());
      continue;
    }

    // Create entry in q no matter what.  We might fill it in below,
    // or we might not.  Even if not, it is necessary to have it,
    // so that we don't revisit id0 during the recursion.
    q->set_new(id, NULL);
    Thread** tp = &q->get_existing(id);
    int j;
    Thread* t;
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
    default:
      LOG(DFATAL) << "unhandled " << ip->opcode() << " in AddToThreadq";
      break;

    case kInstFail:
      break;

    case kInstAltMatch:
      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;

      DCHECK(!ip->last());
      a = {id+1, NULL};
      goto Loop;

    case kInstNop:
      if (!ip->last())
        stk[nstk++] = {id+1, NULL};

      // Continue on.
      a = {ip->out(), NULL};
      goto Loop;

    case kInstCapture:
      if (!ip->last())
        stk[nstk++] = {id+1, NULL};

      if ((j=ip->cap()) < ncapture_) {
        // Push a dummy whose only job is to restore t0
        // once we finish exploring this possibility.
        stk[nstk++] = {0, t0};

        // Record capture.
        t = AllocThread();
        CopyCapture(t->capture, t0->capture);
        t->capture[j] = p;
        t0 = t;
      }
      a = {ip->out(), NULL};
      goto Loop;

    case kInstByteRange:
      if (!ip->Matches(c))
        goto Next;

      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;
      if (ExtraDebug)
        fprintf(stderr, " + %d%s\n", id, FormatCapture(t0->capture).c_str());

      if (ip->hint() == 0)
        break;
      a = {id+ip->hint(), NULL};
      goto Loop;

    case kInstMatch:
      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;
      if (ExtraDebug)
        fprintf(stderr, " ! %d%s\n", id, FormatCapture(t0->capture).c_str());

    Next:
      if (ip->last())
        break;
      a = {id+1, NULL};
      goto Loop;

    case kInstEmptyWidth:
      if (!ip->last())
        stk[nstk++] = {id+1, NULL};

      // Continue on if we have all the right flag bits.
      if (ip->empty() & ~Prog::EmptyFlags(context, p))
        break;
      a = {ip->out(), NULL};
      goto Loop;
    }
  }
}